

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_unpk_16_mm_ay7(void)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) != 0) {
    uVar4 = m68ki_cpu.dar[0xf] - 2;
    m68ki_cpu.dar[0xf] = uVar4;
    my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar4 = pmmu_translate_addr(uVar4);
    }
    uVar1 = m68k_read_memory_8(uVar4 & m68ki_cpu.address_mask);
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar4 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar4 = pmmu_translate_addr(uVar4);
    }
    uVar2 = m68k_read_memory_16(uVar4 & m68ki_cpu.address_mask);
    uVar2 = uVar2 + (uVar1 & 0xf | (uVar1 & 0xf0) << 4);
    uVar3 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
    uVar4 = *(int *)((long)m68ki_cpu.dar + uVar3 + 0x20) - 1;
    *(uint *)((long)m68ki_cpu.dar + uVar3 + 0x20) = uVar4;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar4 = pmmu_translate_addr(uVar4);
    }
    m68k_write_memory_8(uVar4 & m68ki_cpu.address_mask,uVar2 >> 8 & 0xff);
    uVar3 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
    uVar4 = *(int *)((long)m68ki_cpu.dar + uVar3 + 0x20) - 1;
    *(uint *)((long)m68ki_cpu.dar + uVar3 + 0x20) = uVar4;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar4 = pmmu_translate_addr(uVar4);
    }
    m68k_write_memory_8(uVar4 & m68ki_cpu.address_mask,uVar2 & 0xff);
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_unpk_16_mm_ay7(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		/* Note: AX and AY are reversed in Motorola's docs */
		uint src = OPER_A7_PD_8();
		uint ea_dst;

		src = (((src << 4) & 0x0f00) | (src & 0x000f)) + OPER_I_16();
		ea_dst = EA_AX_PD_8();
		m68ki_write_8(ea_dst, (src >> 8) & 0xff);
		ea_dst = EA_AX_PD_8();
		m68ki_write_8(ea_dst, src & 0xff);
		return;
	}
	m68ki_exception_illegal();
}